

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::AddPageToZeroQueue
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,void *address,uint pageCount,
          PageSegmentBase<Memory::VirtualAllocWrapper> *pageSegment)

{
  PageAllocatorBaseCommon *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = HasZeroPageQueue(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x6c4,"(HasZeroPageQueue())","HasZeroPageQueue()");
    if (!bVar3) goto LAB_00668a34;
    *puVar4 = 0;
  }
  pPVar1 = (pageSegment->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
           allocator;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0 ||
      (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
       *)&pPVar1[-1].allocatorType != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x6c5,"(pageSegment->GetAllocator() == this)",
                       "pageSegment->GetAllocator() == this");
    if (!bVar3) {
LAB_00668a34:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  *(PageSegmentBase<Memory::VirtualAllocWrapper> **)((long)address + 8) = pageSegment;
  *(uint *)((long)address + 0x10) = pageCount;
  ZeroPageQueue::PushZeroPageEntry
            ((ZeroPageQueue *)this->backgroundPageQueue,(FreePageEntry *)address);
  this->hasZeroQueuedPages = true;
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AddPageToZeroQueue(__in void * address, uint pageCount, __in TPageSegment * pageSegment)
{
    Assert(HasZeroPageQueue());
    Assert(pageSegment->GetAllocator() == this);
    FreePageEntry * entry = (FreePageEntry *)address;
    entry->segment = pageSegment;
    entry->pageCount = pageCount;
    ((ZeroPageQueue *)backgroundPageQueue)->PushZeroPageEntry(entry);
    this->hasZeroQueuedPages = true;
}